

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

PathTypeHandlerBase * __thiscall
Js::PathTypeHandlerBase::BuildPathTypeFromNewRoot
          (PathTypeHandlerBase *this,DynamicObject *instance,DynamicType **typeRef)

{
  byte bVar1;
  DynamicType *this_00;
  code *pcVar2;
  ushort uVar3;
  PathTypeHandlerBase *pPVar4;
  ObjectSlotAttributes attributes;
  bool bVar5;
  PropertyIndex PVar6;
  int iVar7;
  int iVar8;
  undefined4 *puVar9;
  ScriptContext *scriptContext;
  PathTypeHandlerBase *this_01;
  undefined4 extraout_var;
  ushort uVar11;
  PathTypeSuccessorKey local_68;
  DynamicObject *local_60;
  DynamicType **local_58;
  DynamicType *local_50;
  undefined4 *local_48;
  PathTypeHandlerBase *local_40;
  ushort local_32;
  long lVar10;
  
  local_60 = instance;
  local_40 = this;
  if (typeRef == (DynamicType **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xa94,"(typeRef)","typeRef");
    if (!bVar5) goto LAB_00c4c951;
    *puVar9 = 0;
    local_48 = puVar9;
  }
  else {
    local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  this_00 = *typeRef;
  local_58 = typeRef;
  scriptContext = Js::Type::GetScriptContext(&this_00->super_Type);
  pPVar4 = local_40;
  bVar1 = (local_40->super_DynamicTypeHandler).flags;
  uVar11 = 0;
  this_01 = &PathTypeHandlerNoAttr::New
                       (scriptContext,
                        (((scriptContext->super_ScriptContextBase).javascriptLibrary)->rootPath).ptr
                        ,0,(PropertyIndex)(local_40->super_DynamicTypeHandler).slotCapacity,
                        (local_40->super_DynamicTypeHandler).inlineSlotCapacity,
                        (local_40->super_DynamicTypeHandler).offsetOfInlineSlots,
                        SUB81(((ulong)bVar1 & 0xffffff04) >> 2,0),(bool)((bVar1 & 0x10) >> 4),
                        (DynamicType *)0x0)->super_PathTypeHandlerBase;
  DynamicTypeHandler::SetFlags
            (&this_01->super_DynamicTypeHandler,(pPVar4->super_DynamicTypeHandler).flags & 8);
  local_50 = this_00;
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierSet
            (&this_00->typeHandler,&this_01->super_DynamicTypeHandler);
  iVar7 = (*(pPVar4->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(pPVar4);
  lVar10 = CONCAT44(extraout_var,iVar7);
  while( true ) {
    puVar9 = local_48;
    uVar3 = (local_40->super_DynamicTypeHandler).unusedBytes >> 1;
    local_32 = uVar11;
    if (uVar3 <= uVar11) break;
    iVar7 = (*(local_40->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[8])
                      (local_40,scriptContext,(ulong)uVar11);
    if (lVar10 == 0) {
      attributes = ObjectSlotAttr_Default;
    }
    else {
      attributes = *(ObjectSlotAttributes *)(lVar10 + (ulong)local_32);
    }
    PathTypeSuccessorKey::PathTypeSuccessorKey(&local_68,iVar7,attributes);
    local_50 = PromoteType<false>(this_01,local_50,local_68,true,scriptContext,local_60,&local_32);
    this_01 = FromTypeHandler((local_50->typeHandler).ptr);
    if (attributes == ObjectSlotAttr_Setter) {
      PVar6 = TypePath::LookupInline
                        ((this_01->typePath).ptr,iVar7,
                         (uint)((this_01->super_DynamicTypeHandler).unusedBytes >> 1));
      if (PVar6 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = local_48;
        *local_48 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xaa7,"(getterIndex != Constants::NoSlot)",
                                    "getterIndex != Constants::NoSlot");
        if (!bVar5) goto LAB_00c4c951;
        *puVar9 = 0;
      }
      if ((*(byte *)(lVar10 + (ulong)PVar6) & 0x10) != 0) {
        (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x73])
                  (this_01,(ulong)PVar6,
                   (ulong)(byte)((char)((this_01->super_DynamicTypeHandler).unusedBytes >> 1) - 1));
      }
    }
    uVar11 = local_32 + 1;
  }
  if ((this_01->super_DynamicTypeHandler).unusedBytes >> 1 != uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xaae,"(newTypeHandler->GetPathLength() == GetPathLength())",
                                "newTypeHandler->GetPathLength() == GetPathLength()");
    if (!bVar5) goto LAB_00c4c951;
    *puVar9 = 0;
  }
  iVar7 = (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[6])(this_01);
  iVar8 = (*(local_40->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[6])();
  if (iVar7 != iVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xaaf,"(newTypeHandler->GetPropertyCount() == GetPropertyCount())",
                                "newTypeHandler->GetPropertyCount() == GetPropertyCount()");
    if (!bVar5) goto LAB_00c4c951;
    *puVar9 = 0;
  }
  iVar7 = (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])(this_01);
  iVar8 = (*(local_40->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
  if ((char)iVar7 != (char)iVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xab0,"(newTypeHandler->GetSetterCount() == GetSetterCount())",
                                "newTypeHandler->GetSetterCount() == GetSetterCount()");
    if (!bVar5) {
LAB_00c4c951:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  *local_58 = local_50;
  return this_01;
}

Assistant:

PathTypeHandlerBase *
    PathTypeHandlerBase::BuildPathTypeFromNewRoot(DynamicObject * instance, DynamicType ** typeRef)
    {
        Assert(typeRef);
        DynamicType * type = *typeRef;
        ScriptContext * scriptContext = type->GetScriptContext();

        PathTypeHandlerBase* newTypeHandler = PathTypeHandlerNoAttr::New(scriptContext, scriptContext->GetLibrary()->GetRootPath(), 0, static_cast<PropertyIndex>(this->GetSlotCapacity()), this->GetInlineSlotCapacity(), this->GetOffsetOfInlineSlots(), GetIsLocked(), GetIsShared());
        newTypeHandler->SetFlags(MayBecomeSharedFlag, GetFlags());
        type->typeHandler = newTypeHandler;

        // Promote type based on existing properties to get new type which will be cached and shared
        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        for (PropertyIndex propertyIndex = 0; propertyIndex < GetPathLength(); propertyIndex++)
        {
            Js::PropertyId propertyId = GetPropertyId(scriptContext, propertyIndex);
            ObjectSlotAttributes attr = attributes ? attributes[propertyIndex] : ObjectSlotAttr_Default;
            type = newTypeHandler->PromoteType<false>(type, PathTypeSuccessorKey(propertyId, attr), true, scriptContext, instance, &propertyIndex);
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler());
            if (attr == ObjectSlotAttr_Setter)
            {
                PropertyIndex getterIndex = newTypeHandler->GetTypePath()->LookupInline(propertyId, newTypeHandler->GetPathLength());
                Assert(getterIndex != Constants::NoSlot);
                if (attributes[getterIndex] & ObjectSlotAttr_Accessor)
                {
                    newTypeHandler->SetSetterSlot(getterIndex, (PathTypeSetterSlotIndex)(newTypeHandler->GetPathLength() - 1));
                }
            }
        }
        Assert(newTypeHandler->GetPathLength() == GetPathLength());
        Assert(newTypeHandler->GetPropertyCount() == GetPropertyCount());
        Assert(newTypeHandler->GetSetterCount() == GetSetterCount());

        *typeRef = type;

        return newTypeHandler;
    }